

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O3

UINT8 device_start_ymz280b(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  void *pvVar1;
  UINT8 UVar2;
  DEV_DATA DVar3;
  void *pvVar4;
  long lVar5;
  ymz280b_state *chip;
  
  DVar3.chipInf = calloc(1,0x2e8);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    if (lookup_init == '\0') {
      diff_lookup[0] = 1;
      diff_lookup[1] = 3;
      diff_lookup[2] = 5;
      diff_lookup[3] = 7;
      diff_lookup[4] = 9;
      diff_lookup[5] = 0xb;
      diff_lookup[6] = 0xd;
      diff_lookup[7] = 0xf;
      diff_lookup[8] = -1;
      diff_lookup[9] = -3;
      diff_lookup[10] = -5;
      diff_lookup[0xb] = -7;
      diff_lookup[0xc] = -9;
      diff_lookup[0xd] = -0xb;
      diff_lookup[0xe] = -0xd;
      diff_lookup[0xf] = -0xf;
      lookup_init = '\x01';
    }
    pvVar1 = (void *)((double)cfg->clock / 384.0);
    ((DEV_DATA *)((long)DVar3.chipInf + 0x2c0))->chipInf = pvVar1;
    ((DEV_DATA *)((long)DVar3.chipInf + 0x2c8))->chipInf = (void *)((double)pvVar1 + (double)pvVar1)
    ;
    pvVar4 = calloc(10000,2);
    ((DEV_DATA *)((long)DVar3.chipInf + 0x2e0))->chipInf = pvVar4;
    lVar5 = 0x69;
    do {
      *(undefined1 *)((long)DVar3.chipInf + lVar5) = 0;
      lVar5 = lVar5 + 0x4c;
    } while (lVar5 != 0x2c9);
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = (UINT32)(long)((double)pvVar1 + (double)pvVar1);
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_ymz280b(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ymz280b_state *chip;

	chip = (ymz280b_state *)calloc(1, sizeof(ymz280b_state));
	if (chip == NULL)
		return 0xFF;

	/* compute ADPCM tables */
	compute_tables();

	/* initialize the rest of the structure */
	chip->master_clock = (double)cfg->clock / 384.0;
	chip->rate = chip->master_clock * 2.0;
	// disabled until the frequency calculation gets fixed
	//SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->rate, cfg->smplRate);
	
	chip->mem_size = 0x00;
	chip->mem_base = NULL;
	chip->irq_handler = NULL;
	chip->irq_param = NULL;
	chip->ext_read_handler = NULL;
	chip->ext_write_handler = NULL;
	chip->ext_param = NULL;

	/* allocate memory */
	chip->scratch = (INT16*)calloc(MAX_SAMPLE_CHUNK, sizeof(INT16));

	ymz280b_set_mute_mask(chip, 0x00);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, (UINT32)INTERNAL_SAMPLE_RATE, &devDef);

	return 0x00;
}